

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PieceOfCinematography.h
# Opt level: O3

void __thiscall
PieceOfCinematography::edit(PieceOfCinematography *this,int optionNumber,bool *endOfEditing)

{
  int iVar1;
  istream *piVar2;
  CustomException *pCVar3;
  double dVar4;
  string inputValue;
  string newGenre;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genres;
  char *local_128 [2];
  char local_118 [16];
  value_type local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"");
  switch(optionNumber) {
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"set new rating:",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    std::operator>>((istream *)&std::cin,(string *)local_128);
    dVar4 = atof(local_128[0]);
    if ((10.0 < dVar4) || (dVar4 < 0.0)) {
      pCVar3 = (CustomException *)__cxa_allocate_exception(0x20);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"wrong rating","");
      CustomException::CustomException(pCVar3,&local_50);
      __cxa_throw(pCVar3,&CustomException::typeinfo,CustomException::~CustomException);
    }
    this->rating = dVar4;
    break;
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"set new number of votes:",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    std::operator>>((istream *)&std::cin,(string *)local_128);
    iVar1 = atoi(local_128[0]);
    if (iVar1 < 0) {
      pCVar3 = (CustomException *)__cxa_allocate_exception(0x20);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Number of votes can not be lower than 0","");
      CustomException::CustomException(pCVar3,&local_70);
      __cxa_throw(pCVar3,&CustomException::typeinfo,CustomException::~CustomException);
    }
    this->numberOfVotes = iVar1;
    break;
  case 3:
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"set new title:",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    std::operator>>((istream *)&std::cin,(string *)&local_108);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,local_108._M_dataplus._M_p,
               local_108._M_dataplus._M_p + local_108._M_string_length);
    std::__cxx11::string::_M_assign((string *)&this->title);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == &local_108.field_2) break;
    goto LAB_00104539;
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"set new year of production:",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    std::operator>>((istream *)&std::cin,(string *)local_128);
    iVar1 = atoi(local_128[0]);
    if (iVar1 < 0) {
      pCVar3 = (CustomException *)__cxa_allocate_exception(0x20);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Year of production can not be lower than 0","");
      CustomException::CustomException(pCVar3,&local_90);
      __cxa_throw(pCVar3,&CustomException::typeinfo,CustomException::~CustomException);
    }
    this->yearProduced = iVar1;
    break;
  case 5:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"set new duration:",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    std::operator>>((istream *)&std::cin,(string *)local_128);
    iVar1 = atoi(local_128[0]);
    if (iVar1 < 0) {
      pCVar3 = (CustomException *)__cxa_allocate_exception(0x20);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Duration can not be lower than 0","");
      CustomException::CustomException(pCVar3,&local_b0);
      __cxa_throw(pCVar3,&CustomException::typeinfo,CustomException::~CustomException);
    }
    this->duration = iVar1;
    break;
  case 6:
    local_108._M_string_length = 0;
    local_108.field_2._M_local_buf[0] = '\0';
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"set the genres of the piece of cinematography:",0x2e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"To set each genre type it and then press enter.",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"To finish setting the genres type \"apply\" and press enter.",
               0x3a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    while ((piVar2 = std::operator>>((istream *)&std::cin,(string *)&local_108),
           ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0 &&
           (iVar1 = std::__cxx11::string::compare((char *)&local_108), iVar1 != 0))) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_e8,&local_108);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->genres,&local_e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == &local_108.field_2) break;
LAB_00104539:
    operator_delete(local_108._M_dataplus._M_p);
    break;
  case 7:
    *endOfEditing = true;
    break;
  default:
    if (optionNumber <= this->numberOfOptions) break;
  case 0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wrong number",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
  }
  if (local_128[0] != local_118) {
    operator_delete(local_128[0]);
  }
  return;
}

Assistant:

virtual void edit(int optionNumber, bool &endOfEditing) {
        try {
            string inputValue="";
            if (optionNumber == 1) {
                double newRating = 0;
                cout << "set new rating:" << endl;
                cin >> inputValue;
                newRating = atof(inputValue.c_str());
                if(newRating>10 || newRating<0) throw CustomException("wrong rating");
                setRating(newRating);
            } else if (optionNumber == 2) {
                int newNumberOfVotes = 0;
                cout << "set new number of votes:" << endl;
                cin >> inputValue;
                newNumberOfVotes = atoi(inputValue.c_str());
                if(newNumberOfVotes<0) throw CustomException("Number of votes can not be lower than 0");
                setNumberOfVotes(newNumberOfVotes);
            } else if (optionNumber == 3) {
                string newTitle = "";
                cout << "set new title:" << endl;
                cin >> newTitle;
                setTitle(newTitle);
            } else if (optionNumber == 4) {
                int newYearOfProduction = 0;
                cout << "set new year of production:" << endl;
                cin >> inputValue;
                newYearOfProduction=atoi(inputValue.c_str());
                if(newYearOfProduction<0) throw CustomException("Year of production can not be lower than 0");
                setYearProduced(newYearOfProduction);
            } else if (optionNumber == 5) {
                int newDuration = 0;
                cout << "set new duration:" << endl;
                cin >> inputValue;
                newDuration=atoi(inputValue.c_str());
                if(newDuration<0) throw CustomException("Duration can not be lower than 0");
                setDuration(newDuration);
            } else if (optionNumber == 6) {
                string newGenre;
                vector<string> genres;
                cout << "set the genres of the piece of cinematography:" << endl;
                cout << "To set each genre type it and then press enter." << endl;
                cout << "To finish setting the genres type \"apply\" and press enter." << endl;
                while (cin >> newGenre) {
                    if (newGenre == "apply") break;
                    genres.push_back(newGenre);
                }
                setGenres(genres);
            } else if (optionNumber == 7) {
                endOfEditing = true;
            } else {
                if (optionNumber == 0 || optionNumber > numberOfOptions) {
                    cout << "wrong number" << endl;
                }
            }
        } catch(CustomException &e){
            cout<<e.getMessage()<<endl;
        }
    }